

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEIDeriv1_Writer.cpp
# Opt level: O0

void __thiscall OSTEIDeriv1_Writer::WriteShellOffsets(OSTEIDeriv1_Writer *this)

{
  bool bVar1;
  ostream *poVar2;
  QAM *in_RDI;
  QAM *it;
  iterator __end1;
  iterator __begin1;
  QAMSet *__range1;
  OSTEI_HRR_Algorithm_Base *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  QAM *in_stack_ffffffffffffff68;
  string local_88 [48];
  reference local_58;
  _Self local_50;
  _Self local_48;
  undefined1 local_40 [48];
  undefined1 *local_10;
  
  poVar2 = std::operator<<(*(ostream **)((in_RDI->qam)._M_elems + 2),(string *)indent5_abi_cxx11_);
  std::operator<<(poVar2,"// calculate the shell offsets\n");
  poVar2 = std::operator<<(*(ostream **)((in_RDI->qam)._M_elems + 2),(string *)indent5_abi_cxx11_);
  std::operator<<(poVar2,"// these are the offset from the shell pointed to by cd\n");
  poVar2 = std::operator<<(*(ostream **)((in_RDI->qam)._M_elems + 2),(string *)indent5_abi_cxx11_);
  std::operator<<(poVar2,"// for each element\n");
  poVar2 = std::operator<<(*(ostream **)((in_RDI->qam)._M_elems + 2),(string *)indent5_abi_cxx11_);
  std::operator<<(poVar2,"int shelloffsets[SIMINT_SIMD_LEN] = {0};\n");
  poVar2 = std::operator<<(*(ostream **)((in_RDI->qam)._M_elems + 2),(string *)indent5_abi_cxx11_);
  std::operator<<(poVar2,"int lastoffset = 0;\n");
  poVar2 = std::operator<<(*(ostream **)((in_RDI->qam)._M_elems + 2),(string *)indent5_abi_cxx11_);
  std::operator<<(poVar2,
                  "const int nlane = ( ((j + SIMINT_SIMD_LEN) < jend) ? SIMINT_SIMD_LEN : (jend - j));\n"
                 );
  std::operator<<(*(ostream **)((in_RDI->qam)._M_elems + 2),"\n");
  poVar2 = std::operator<<(*(ostream **)((in_RDI->qam)._M_elems + 2),(string *)indent5_abi_cxx11_);
  std::operator<<(poVar2,"if((iprimcd + SIMINT_SIMD_LEN) >= nprim_icd)\n");
  poVar2 = std::operator<<(*(ostream **)((in_RDI->qam)._M_elems + 2),(string *)indent5_abi_cxx11_);
  std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(*(ostream **)((in_RDI->qam)._M_elems + 2),(string *)indent6_abi_cxx11_);
  std::operator<<(poVar2,"// Handle if the first element of the vector is a new shell\n");
  poVar2 = std::operator<<(*(ostream **)((in_RDI->qam)._M_elems + 2),(string *)indent6_abi_cxx11_);
  std::operator<<(poVar2,"if(iprimcd >= nprim_icd && ((icd+1) < nshellbatch))\n");
  poVar2 = std::operator<<(*(ostream **)((in_RDI->qam)._M_elems + 2),(string *)indent6_abi_cxx11_);
  std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(*(ostream **)((in_RDI->qam)._M_elems + 2),(string *)indent7_abi_cxx11_);
  std::operator<<(poVar2,"nprim_icd += Q.nprim12[cd + (++icd)];\n");
  OSTEI_HRR_Writer::Algo(*(OSTEI_HRR_Writer **)&in_RDI->field_0x28);
  OSTEI_HRR_Algorithm_Base::TopAM(in_stack_ffffffffffffff18);
  local_10 = local_40;
  local_48._M_node =
       (_Base_ptr)
       std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::begin
                 ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)in_stack_ffffffffffffff18);
  local_50._M_node =
       (_Base_ptr)
       std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::end
                 ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)in_stack_ffffffffffffff18);
  while( true ) {
    bVar1 = std::operator!=(&local_48,&local_50);
    if (!bVar1) break;
    local_58 = std::_Rb_tree_const_iterator<QAM>::operator*
                         ((_Rb_tree_const_iterator<QAM> *)
                          CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    poVar2 = std::operator<<(*(ostream **)((in_RDI->qam)._M_elems + 2),(string *)indent7_abi_cxx11_)
    ;
    PrimPtrName_abi_cxx11_(in_stack_ffffffffffffff68);
    poVar2 = std::operator<<(poVar2,local_88);
    poVar2 = std::operator<<(poVar2," += ");
    QAM::QAM((QAM *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             (QAM *)in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff24 = NCART(in_RDI);
    in_stack_ffffffffffffff18 =
         (OSTEI_HRR_Algorithm_Base *)std::ostream::operator<<(poVar2,in_stack_ffffffffffffff24);
    std::operator<<((ostream *)in_stack_ffffffffffffff18,";\n");
    QAM::~QAM((QAM *)0x160f09);
    std::__cxx11::string::~string(local_88);
    std::_Rb_tree_const_iterator<QAM>::operator++
              ((_Rb_tree_const_iterator<QAM> *)
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  }
  std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::~set
            ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)0x160e3a);
  poVar2 = std::operator<<(*(ostream **)((in_RDI->qam)._M_elems + 2),(string *)indent6_abi_cxx11_);
  std::operator<<(poVar2,"}\n");
  poVar2 = std::operator<<(*(ostream **)((in_RDI->qam)._M_elems + 2),(string *)indent6_abi_cxx11_);
  std::operator<<(poVar2,"iprimcd++;\n");
  poVar2 = std::operator<<(*(ostream **)((in_RDI->qam)._M_elems + 2),(string *)indent6_abi_cxx11_);
  std::operator<<(poVar2,"for(n = 1; n < SIMINT_SIMD_LEN; ++n)\n");
  poVar2 = std::operator<<(*(ostream **)((in_RDI->qam)._M_elems + 2),(string *)indent6_abi_cxx11_);
  std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(*(ostream **)((in_RDI->qam)._M_elems + 2),(string *)indent7_abi_cxx11_);
  std::operator<<(poVar2,"if(iprimcd >= nprim_icd && ((icd+1) < nshellbatch))\n");
  poVar2 = std::operator<<(*(ostream **)((in_RDI->qam)._M_elems + 2),(string *)indent7_abi_cxx11_);
  std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(*(ostream **)((in_RDI->qam)._M_elems + 2),(string *)indent8_abi_cxx11_);
  std::operator<<(poVar2,"shelloffsets[n] = shelloffsets[n-1] + 1;\n");
  poVar2 = std::operator<<(*(ostream **)((in_RDI->qam)._M_elems + 2),(string *)indent8_abi_cxx11_);
  std::operator<<(poVar2,"lastoffset++;\n");
  poVar2 = std::operator<<(*(ostream **)((in_RDI->qam)._M_elems + 2),(string *)indent8_abi_cxx11_);
  std::operator<<(poVar2,"nprim_icd += Q.nprim12[cd + (++icd)];\n");
  poVar2 = std::operator<<(*(ostream **)((in_RDI->qam)._M_elems + 2),(string *)indent7_abi_cxx11_);
  std::operator<<(poVar2,"}\n");
  poVar2 = std::operator<<(*(ostream **)((in_RDI->qam)._M_elems + 2),(string *)indent7_abi_cxx11_);
  std::operator<<(poVar2,"else\n");
  poVar2 = std::operator<<(*(ostream **)((in_RDI->qam)._M_elems + 2),(string *)indent8_abi_cxx11_);
  std::operator<<(poVar2,"shelloffsets[n] = shelloffsets[n-1];\n");
  poVar2 = std::operator<<(*(ostream **)((in_RDI->qam)._M_elems + 2),(string *)indent7_abi_cxx11_);
  std::operator<<(poVar2,"iprimcd++;\n");
  poVar2 = std::operator<<(*(ostream **)((in_RDI->qam)._M_elems + 2),(string *)indent6_abi_cxx11_);
  std::operator<<(poVar2,"}\n");
  poVar2 = std::operator<<(*(ostream **)((in_RDI->qam)._M_elems + 2),(string *)indent5_abi_cxx11_);
  std::operator<<(poVar2,"}\n");
  poVar2 = std::operator<<(*(ostream **)((in_RDI->qam)._M_elems + 2),(string *)indent5_abi_cxx11_);
  std::operator<<(poVar2,"else\n");
  poVar2 = std::operator<<(*(ostream **)((in_RDI->qam)._M_elems + 2),(string *)indent6_abi_cxx11_);
  std::operator<<(poVar2,"iprimcd += SIMINT_SIMD_LEN;\n\n");
  return;
}

Assistant:

void OSTEIDeriv1_Writer::WriteShellOffsets(void) const
{
    os_ << indent5 << "// calculate the shell offsets\n";
    os_ << indent5 << "// these are the offset from the shell pointed to by cd\n";
    os_ << indent5 << "// for each element\n";
    os_ << indent5 << "int shelloffsets[SIMINT_SIMD_LEN] = {0};\n";
    os_ << indent5 << "int lastoffset = 0;\n";
    os_ << indent5 << "const int nlane = ( ((j + SIMINT_SIMD_LEN) < jend) ? SIMINT_SIMD_LEN : (jend - j));\n";
    os_ << "\n";
    os_ << indent5 << "if((iprimcd + SIMINT_SIMD_LEN) >= nprim_icd)\n";
    os_ << indent5 << "{\n";

    os_ << indent6 << "// Handle if the first element of the vector is a new shell\n";
    os_ << indent6 << "if(iprimcd >= nprim_icd && ((icd+1) < nshellbatch))\n";
    os_ << indent6 << "{\n";
    os_ << indent7 << "nprim_icd += Q.nprim12[cd + (++icd)];\n";

    for(const auto &it : hrr_writer_.Algo().TopAM())
        os_ << indent7 << PrimPtrName(it) << " += " << NCART(it) << ";\n";

    os_ << indent6 << "}\n";
    os_ << indent6 << "iprimcd++;\n";

    os_ << indent6 << "for(n = 1; n < SIMINT_SIMD_LEN; ++n)\n";
    os_ << indent6 << "{\n";
    os_ << indent7 << "if(iprimcd >= nprim_icd && ((icd+1) < nshellbatch))\n";
    os_ << indent7 << "{\n";
    os_ << indent8 << "shelloffsets[n] = shelloffsets[n-1] + 1;\n";
    os_ << indent8 << "lastoffset++;\n";
    os_ << indent8 << "nprim_icd += Q.nprim12[cd + (++icd)];\n";
    os_ << indent7 << "}\n";
    os_ << indent7 << "else\n";
    os_ << indent8 << "shelloffsets[n] = shelloffsets[n-1];\n";
    os_ << indent7 << "iprimcd++;\n";
    os_ << indent6 << "}\n";
    os_ << indent5 << "}\n";
    os_ << indent5 << "else\n";
    os_ << indent6 << "iprimcd += SIMINT_SIMD_LEN;\n\n";
}